

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

bool __thiscall
Fossilize::StateReplayer::Impl::parse_viewport_depth_clip_control
          (Impl *this,Value *state,VkPipelineViewportDepthClipControlCreateInfoEXT **out_info)

{
  uint uVar1;
  VkPipelineViewportDepthClipControlCreateInfoEXT *pVVar2;
  Type this_00;
  VkPipelineViewportDepthClipControlCreateInfoEXT *info;
  VkPipelineViewportDepthClipControlCreateInfoEXT **out_info_local;
  Value *state_local;
  Impl *this_local;
  
  pVVar2 = ScratchAllocator::allocate_cleared<VkPipelineViewportDepthClipControlCreateInfoEXT>
                     (&this->allocator);
  *out_info = pVVar2;
  this_00 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
            ::operator[]<char_const>
                      ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                        *)state,"negativeOneToOne");
  uVar1 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GetUint(this_00);
  pVVar2->negativeOneToOne = uVar1;
  return true;
}

Assistant:

bool StateReplayer::Impl::parse_viewport_depth_clip_control(const Value &state,
                                                            VkPipelineViewportDepthClipControlCreateInfoEXT **out_info)
{
	auto *info = allocator.allocate_cleared<VkPipelineViewportDepthClipControlCreateInfoEXT>();
	*out_info = info;
	info->negativeOneToOne = state["negativeOneToOne"].GetUint();
	return true;
}